

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  vector<Node_*,_std::allocator<Node_*>_> *this_00;
  bool bVar1;
  ostream *poVar2;
  reference ppNVar3;
  reference ppNVar4;
  byte local_302;
  byte local_2e2;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> local_2c0;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> local_270;
  vector<Node_*,_std::allocator<Node_*>_> local_220;
  Node *local_208;
  Node *currentChild;
  Node *i;
  iterator __end2;
  iterator __begin2;
  vector<Node_*,_std::allocator<Node_*>_> *__range2;
  Node *currentNode;
  vector<Node_*,_std::allocator<Node_*>_> solution;
  int count;
  bool goalFound;
  undefined1 local_1b0 [8];
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> closedList;
  queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> openList;
  undefined1 local_f8 [8];
  Node init;
  int local_b8 [12];
  iterator local_88;
  size_type local_80;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> goalState;
  value_type_conflict local_58;
  value_type_conflict local_54;
  value_type_conflict local_50;
  value_type_conflict local_4c;
  value_type_conflict local_48;
  value_type_conflict local_44;
  value_type_conflict local_40;
  value_type_conflict local_2c;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> initial;
  
  initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  local_2c = 1;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&local_2c);
  local_40 = 2;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffc0);
  local_44 = 3;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffbc);
  local_48 = 4;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffb8);
  local_4c = 0;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffb4);
  local_50 = 5;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffb0);
  local_54 = 6;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffac);
  local_58 = 7;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,&stack0xffffffffffffffa8);
  goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 8;
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)local_28,
             (value_type_conflict *)
             ((long)&goalState.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  local_b8[4] = 5;
  local_b8[5] = 6;
  local_b8[6] = 7;
  local_b8[7] = 8;
  local_b8[0] = 1;
  local_b8[1] = 2;
  local_b8[2] = 3;
  local_b8[3] = 4;
  local_b8[8] = 0;
  local_88 = local_b8;
  local_80 = 9;
  this = (allocator<int> *)((long)&init.parent + 7);
  std::allocator<int>::allocator(this);
  __l._M_len = local_80;
  __l._M_array = local_88;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,__l,this);
  std::allocator<int>::~allocator((allocator<int> *)((long)&init.parent + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,(vector<int,_std::allocator<int>_> *)local_28
            );
  Node::Node((Node *)local_f8,
             (vector<int,_std::allocator<int>_> *)
             &openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,(Node *)0x0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &openList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::queue<Node*,std::deque<Node*,std::allocator<Node*>>>::
  queue<std::deque<Node*,std::allocator<Node*>>,void>
            ((queue<Node*,std::deque<Node*,std::allocator<Node*>>> *)
             &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::queue<Node*,std::deque<Node*,std::allocator<Node*>>>::
  queue<std::deque<Node*,std::allocator<Node*>>,void>
            ((queue<Node*,std::deque<Node*,std::allocator<Node*>>> *)local_1b0);
  _count = (value_type)local_f8;
  std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::push
            ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
             &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node,(value_type *)&count);
  solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 0;
  solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)&currentNode);
  poVar2 = std::operator<<((ostream *)&std::cout,"Searching for solution...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  while( true ) {
    bVar1 = std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::empty
                      ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
                       &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node);
    local_2e2 = 0;
    if (!bVar1) {
      local_2e2 = solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff;
    }
    if ((local_2e2 & 1) == 0) break;
    ppNVar3 = std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::front
                        ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
                         &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_node);
    __range2 = &(*ppNVar3)->children;
    std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::push
              ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)local_1b0,
               (value_type *)&__range2);
    std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::pop
              ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
               &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    Node::moveUp((Node *)__range2);
    Node::moveDown((Node *)__range2);
    Node::moveRight((Node *)__range2);
    Node::moveLeft((Node *)__range2);
    this_00 = __range2;
    __end2 = std::vector<Node_*,_std::allocator<Node_*>_>::begin(__range2);
    i = (Node *)std::vector<Node_*,_std::allocator<Node_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                                       *)&i), bVar1) {
      ppNVar4 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                ::operator*(&__end2);
      local_208 = *ppNVar4;
      currentChild = local_208;
      bVar1 = std::operator==(&local_208->puzzle,(vector<int,_std::allocator<int>_> *)local_78);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Goal Found.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        std::vector<Node_*,_std::allocator<Node_*>_>::vector
                  (&local_220,(vector<Node_*,_std::allocator<Node_*>_> *)&currentNode);
        traceSolution(&local_220,local_208);
        std::vector<Node_*,_std::allocator<Node_*>_>::~vector(&local_220);
        solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._7_1_ = 1;
      }
      std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::queue
                (&local_270,
                 (queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
                 &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      bVar1 = contains(&local_270,local_208);
      local_302 = 0;
      if (!bVar1) {
        std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::queue
                  (&local_2c0,
                   (queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)local_1b0);
        bVar1 = contains(&local_2c0,local_208);
        local_302 = bVar1 ^ 0xff;
        std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::~queue(&local_2c0);
      }
      std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::~queue(&local_270);
      if ((local_302 & 1) != 0) {
        std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::push
                  ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
                   &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_node,&local_208);
      }
      __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
      operator++(&__end2);
    }
    solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ =
         (int)solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"No. of nodes in closed list: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(int)solution.super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)&currentNode);
  std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::~queue
            ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)local_1b0);
  std::queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_>::~queue
            ((queue<Node_*,_std::deque<Node_*,_std::allocator<Node_*>_>_> *)
             &closedList.c.super__Deque_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  Node::~Node((Node *)local_f8);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return initial.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main() {
  std::vector<int> initial;
  initial.push_back(1);
  initial.push_back(2);
  initial.push_back(3);
  initial.push_back(4);
  initial.push_back(0);
  initial.push_back(5);
  initial.push_back(6);
  initial.push_back(7);
  initial.push_back(8);
  vector<int> goalState = { 1, 2, 3, 4, 5, 6, 7, 8, 0 };
  Node init = Node(initial, NULL);
  std::queue<Node*> openList;
  std::queue<Node*> closedList;
  openList.push(&init);
  bool goalFound = false;
  int count = 0;
  vector<Node*> solution;
  cout << "Searching for solution..." << endl;
  while (!openList.empty() && !goalFound) {
    Node* currentNode = openList.front();
    closedList.push(currentNode);
    openList.pop();
    currentNode->moveUp();
    currentNode->moveDown();
    currentNode->moveRight();
    currentNode->moveLeft();

    for (auto i : currentNode->children) {
      Node* currentChild = i;
      if (currentChild->puzzle == goalState) {
        std::cout << "Goal Found." << endl;
        traceSolution(solution, currentChild);
        goalFound = true;

      }
      if (!contains(openList, currentChild)
          && !contains(closedList, currentChild)) {
        openList.push(currentChild);
      }

    }
    count++;
  }
  cout << "No. of nodes in closed list: " << count << endl;
//  printToFile(closedList);  // uncomment this line to print node in text file
}